

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O3

void gray_hline(PWorker worker,TCoord x,TCoord y,TPos area,int acount)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  PVG_FT_Span *pPVar8;
  long lVar9;
  
  uVar4 = (uint)((ulong)area >> 9);
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  if (((worker->outline).flags & 2) == 0) {
    uVar4 = 0xff;
    if (uVar3 < 0xff) {
      uVar4 = uVar3;
    }
  }
  else {
    uVar3 = uVar3 & 0x1ff;
    if (uVar3 < 0x101) {
      uVar4 = 0xff;
      if (uVar3 != 0x100) {
        uVar4 = uVar3;
      }
    }
    else {
      uVar4 = 0x200 - uVar3;
    }
  }
  lVar9 = y + worker->min_ey;
  lVar7 = x + worker->min_ex;
  if (0x7ffffe < lVar7) {
    lVar7 = 0x7fffff;
  }
  if (0x7ffffe < lVar9) {
    lVar9 = 0x7fffff;
  }
  if (uVar4 != 0) {
    uVar3 = worker->num_gray_spans;
    lVar6 = (long)(int)uVar3;
    pPVar8 = worker->gray_spans + lVar6;
    if (0 < lVar6) {
      if (((lVar9 == worker->gray_spans[lVar6 + -1].y) &&
          (iVar1 = worker->gray_spans[lVar6 + -1].len,
          lVar7 == (long)worker->gray_spans[lVar6 + -1].x + (long)iVar1)) &&
         (uVar4 == worker->gray_spans[lVar6 + -1].coverage)) {
        worker->gray_spans[lVar6 + -1].len = iVar1 + acount;
        return;
      }
      if (0xff < uVar3) {
        pPVar8 = worker->gray_spans;
        if ((worker->render_span != (PVG_FT_SpanFunc)0x0) &&
           (uVar2 = worker->skip_spans, (int)uVar2 < (int)uVar3)) {
          uVar5 = 0;
          if (0 < (int)uVar2) {
            uVar5 = (ulong)uVar2;
          }
          (*worker->render_span)(uVar3 - (int)uVar5,pPVar8 + uVar5,worker->render_span_data);
          uVar3 = worker->num_gray_spans;
        }
        worker->skip_spans = worker->skip_spans - uVar3;
        uVar3 = 0;
      }
    }
    pPVar8->x = (int)lVar7;
    pPVar8->len = acount;
    pPVar8->y = (int)lVar9;
    pPVar8->coverage = (uchar)uVar4;
    worker->num_gray_spans = uVar3 + 1;
  }
  return;
}

Assistant:

static void
  gray_hline( RAS_ARG_ TCoord  x,
                       TCoord  y,
                       TPos    area,
                       int     acount )
  {
    int coverage;


    /* compute the coverage line's coverage, depending on the    */
    /* outline fill rule                                         */
    /*                                                           */
    /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
    /*                                                           */
    coverage = (int)( area >> ( PIXEL_BITS * 2 + 1 - 8 ) );
                                                    /* use range 0..256 */
    if ( coverage < 0 )
      coverage = -coverage;

    if ( ras.outline.flags & PVG_FT_OUTLINE_EVEN_ODD_FILL )
    {
      coverage &= 511;

      if ( coverage > 256 )
        coverage = 512 - coverage;
      else if ( coverage == 256 )
        coverage = 255;
    }
    else
    {
      /* normal non-zero winding rule */
      if ( coverage >= 256 )
        coverage = 255;
    }

    y += (TCoord)ras.min_ey;
    x += (TCoord)ras.min_ex;

    /* PVG_FT_Span.x is an int, so limit our coordinates appropriately */
    if ( x >= (1 << 23) )
      x = (1 << 23) - 1;

    /* PVG_FT_Span.y is an int, so limit our coordinates appropriately */
    if ( y >= (1 << 23) )
      y = (1 << 23) - 1;

    if ( coverage )
    {
      PVG_FT_Span*  span;
      int       count;
      int       skip;

      /* see whether we can add this span to the current list */
      count = ras.num_gray_spans;
      span  = ras.gray_spans + count - 1;
      if ( count > 0                          &&
           span->y == y                       &&
           span->x + span->len == x           &&
           span->coverage == coverage         )
      {
        span->len = span->len + acount;
        return;
      }

      if ( count >= PVG_FT_MAX_GRAY_SPANS )
      {
        if ( ras.render_span && count > ras.skip_spans )
        {
          skip = ras.skip_spans > 0 ? ras.skip_spans : 0;
          ras.render_span( ras.num_gray_spans - skip,
                           ras.gray_spans + skip,
                           ras.render_span_data );
        }

        ras.skip_spans -= ras.num_gray_spans;
        /* ras.render_span( span->y, ras.gray_spans, count ); */
        ras.num_gray_spans = 0;

        span  = ras.gray_spans;
      }
      else
        span++;

      /* add a gray span to the current list */
      span->x        = x;
      span->len      = acount;
      span->y        = y;
      span->coverage = (unsigned char)coverage;

      ras.num_gray_spans++;
    }
  }